

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indirect_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12e98c::CpuIndirectIndexedTest::run_read_instruction_with_pagecrossing
          (CpuIndirectIndexedTest *this,uint8_t instruction)

{
  uint16_t uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar7;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar8;
  char *message;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_248;
  WithoutMatchers local_221;
  Matcher<unsigned_short> local_220;
  MockSpec<unsigned_char_(unsigned_short)> local_208;
  ReturnAction<int> local_1e8;
  Action<unsigned_char_(unsigned_short)> local_1d8;
  WithoutMatchers local_1b1;
  Matcher<unsigned_short> local_1b0;
  MockSpec<unsigned_char_(unsigned_short)> local_198;
  unsigned_short local_172;
  undefined1 local_170 [6];
  uint16_t effective_address;
  Action<unsigned_char_(unsigned_short)> local_160;
  WithoutMatchers local_139;
  Matcher<unsigned_short> local_138;
  MockSpec<unsigned_char_(unsigned_short)> local_120;
  ReturnAction<int> local_100;
  Action<unsigned_char_(unsigned_short)> local_f0;
  WithoutMatchers local_c9;
  Matcher<unsigned_short> local_c8;
  MockSpec<unsigned_char_(unsigned_short)> local_b0;
  ReturnAction<int> local_90;
  Action<unsigned_char_(unsigned_short)> local_80;
  WithoutMatchers local_5d [13];
  Matcher<unsigned_short> local_50;
  MockSpec<unsigned_char_(unsigned_short)> local_38;
  uint8_t local_11;
  CpuIndirectIndexedTest *pCStack_10;
  uint8_t instruction_local;
  CpuIndirectIndexedTest *this_local;
  uint uVar6;
  
  uVar1 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar1;
  (this->super_CpuTest).registers.pc = uVar1;
  (this->super_CpuTest).expected.y = 0xed;
  (this->super_CpuTest).registers.y = 0xed;
  local_11 = instruction;
  pCStack_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  uVar2 = (this->super_CpuTest).expected.pc;
  if (SCARRY4((uint)uVar2,1)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  (this->super_CpuTest).expected.pc = uVar2 + 1;
  testing::Matcher<unsigned_short>::Matcher
            (&local_50,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_38,&(this->super_CpuTest).mmu.super_MockMmu,&local_50);
  testing::internal::GetWithoutMatchers();
  pMVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_38,local_5d,(void *)0x0);
  pTVar8 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                      ,0x25,"mmu","read_byte(start_pc + 1u)");
  testing::Return<int>((testing *)&local_90,0x42);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_80,(ReturnAction *)&local_90);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar8,&local_80);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_80);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_90);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_38);
  testing::Matcher<unsigned_short>::~Matcher(&local_50);
  testing::Matcher<unsigned_short>::Matcher(&local_c8,0x42);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_b0,&(this->super_CpuTest).mmu.super_MockMmu,&local_c8);
  testing::internal::GetWithoutMatchers();
  pMVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_b0,&local_c9,(void *)0x0);
  pTVar8 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                      ,0x26,"mmu","read_byte(0x42)");
  testing::Return<int>((testing *)&local_100,0x34);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_f0,(ReturnAction *)&local_100);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar8,&local_f0);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_f0);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_100);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_b0);
  testing::Matcher<unsigned_short>::~Matcher(&local_c8);
  testing::Matcher<unsigned_short>::Matcher(&local_138,0x43);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_120,&(this->super_CpuTest).mmu.super_MockMmu,&local_138);
  testing::internal::GetWithoutMatchers();
  pMVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_120,&local_139,(void *)0x0);
  pTVar8 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                      ,0x27,"mmu","read_byte(0x43)");
  testing::Return<int>((testing *)local_170,0x12);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_160,(ReturnAction *)local_170);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar8,&local_160);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_160);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)local_170);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_120);
  testing::Matcher<unsigned_short>::~Matcher(&local_138);
  uVar6 = (uint)(this->super_CpuTest).registers.y;
  iVar5 = uVar6 + 0x1234;
  if (!SCARRY4(uVar6,0x1234)) {
    local_172 = (unsigned_short)iVar5;
    if (!SBORROW4(iVar5,0x100)) {
      testing::Matcher<unsigned_short>::Matcher(&local_1b0,local_172 - 0x100);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_198,&(this->super_CpuTest).mmu.super_MockMmu,&local_1b0);
      testing::internal::GetWithoutMatchers();
      pMVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_198,&local_1b1,(void *)0x0);
      pTVar8 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                          ,0x2a,"mmu","read_byte(effective_address - 0x0100)");
      testing::Return<int>((testing *)&local_1e8,0);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_1d8,(ReturnAction *)&local_1e8);
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar8,&local_1d8);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_1d8);
      testing::internal::ReturnAction<int>::~ReturnAction(&local_1e8);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_198);
      testing::Matcher<unsigned_short>::~Matcher(&local_1b0);
      testing::Matcher<unsigned_short>::Matcher(&local_220,local_172);
      n_e_s::core::test::MockMmu::gmock_read_byte
                (&local_208,&(this->super_CpuTest).mmu.super_MockMmu,&local_220);
      testing::internal::GetWithoutMatchers();
      pMVar7 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                         (&local_208,&local_221,(void *)0x0);
      pTVar8 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                         (pMVar7,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                          ,0x2c,"mmu","read_byte(effective_address)");
      testing::Return<unsigned_char>
                ((testing *)&gtest_ar.message_,(this->super_CpuTest).field_0x114);
      testing::internal::ReturnAction::operator_cast_to_Action
                (&local_248,(ReturnAction *)&gtest_ar.message_);
      testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
                (pTVar8,&local_248);
      testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_248);
      testing::internal::ReturnAction<unsigned_char>::~ReturnAction
                ((ReturnAction<unsigned_char> *)&gtest_ar.message_);
      testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_208);
      testing::Matcher<unsigned_short>::~Matcher(&local_220);
      n_e_s::core::test::CpuTest::step_execution(&this->super_CpuTest,'\x06');
      testing::internal::EqHelper::
      Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
                ((EqHelper *)local_268,"expected","registers",&(this->super_CpuTest).expected,
                 &(this->super_CpuTest).registers);
      bVar4 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar4) {
        testing::Message::Message(&local_270);
        message = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  (&local_278,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_indirect_indexed_instructions.cpp"
                   ,0x2f,message);
        testing::internal::AssertHelper::operator=(&local_278,&local_270);
        testing::internal::AssertHelper::~AssertHelper(&local_278);
        testing::Message::~Message(&local_270);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      return;
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void run_read_instruction_with_pagecrossing(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        registers.y = expected.y = 0xED;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x42));
        EXPECT_CALL(mmu, read_byte(0x42)).WillOnce(Return(0x34));
        EXPECT_CALL(mmu, read_byte(0x43)).WillOnce(Return(0x12));

        const uint16_t effective_address = 0x1234 + registers.y;
        EXPECT_CALL(mmu, read_byte(effective_address - 0x0100))
                .WillOnce(Return(0x00)); // Dummy read
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        step_execution(6);
        EXPECT_EQ(expected, registers);
    }